

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O0

void __thiscall
Projection::ConvertUnew(Projection *this,MultiFab *Unew,MultiFab *Uold,Real alpha,BoxArray *grids)

{
  bool bVar1;
  Box *in_stack_00000040;
  Real in_stack_00000048;
  FArrayBox *in_stack_00000050;
  Box *bx;
  MFIter Uoldmfi;
  MFIter *in_stack_ffffffffffffff18;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffff20;
  bool in_stack_ffffffffffffff47;
  FabArrayBase *in_stack_ffffffffffffff48;
  MFIter *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff8c;
  undefined8 in_stack_ffffffffffffff90;
  
  amrex::MFIter::MFIter
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff47);
  while( true ) {
    bVar1 = amrex::MFIter::isValid((MFIter *)&stack0xffffffffffffff78);
    if (!bVar1) break;
    in_stack_ffffffffffffff20 = (FabArray<amrex::FArrayBox> *)&stack0xffffffffffffff54;
    amrex::MFIter::growntilebox((MFIter *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    amrex::FabArray<amrex::FArrayBox>::operator[]
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    amrex::FabArray<amrex::FArrayBox>::operator[]
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    ConvertUnew((Projection *)
                Uoldmfi.m_fa._M_t.
                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl,(FArrayBox *)bx,
                in_stack_00000050,in_stack_00000048,in_stack_00000040);
    amrex::MFIter::operator++((MFIter *)&stack0xffffffffffffff78);
  }
  amrex::MFIter::~MFIter((MFIter *)in_stack_ffffffffffffff20);
  return;
}

Assistant:

void
Projection::ConvertUnew (MultiFab&       Unew,
                         MultiFab&       Uold,
                         Real            alpha,
                         const BoxArray& grids)
{
#ifdef _OPENMP
#pragma omp parallel
#endif
  for (MFIter Uoldmfi(Uold,true); Uoldmfi.isValid(); ++Uoldmfi)
  {
        const Box& bx=Uoldmfi.growntilebox(1);
        AMREX_ASSERT(grids[Uoldmfi.index()].contains(Uoldmfi.tilebox())==true);

        ConvertUnew(Unew[Uoldmfi],Uold[Uoldmfi],alpha,bx);
  }
}